

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_format.cpp
# Opt level: O2

ON_wString __thiscall
ON_wString::FromYearMonthDayHourMinuteSecond
          (ON_wString *this,int year,int month,int mday,int hour,int minute,int second,
          ON_DateFormat date_format,ON_TimeFormat time_format,wchar_t date_separator,
          wchar_t date_time_separator,wchar_t time_separator)

{
  bool bVar1;
  uint uVar2;
  wchar_t wVar3;
  uint year_00;
  ulong uVar4;
  uint date_00;
  ulong uVar5;
  uint month_00;
  ulong uVar6;
  ulong uVar7;
  wchar_t *pwVar8;
  ON_wString hms;
  wchar_t dts [2];
  ON_wString date;
  wchar_t ds [2];
  wchar_t ts [2];
  
  uVar7 = 0;
  uVar2 = 0;
  uVar4 = (ulong)(uint)year;
  if (year < 0x62e) {
    uVar4 = uVar7;
  }
  uVar5 = (ulong)(uint)mday;
  if (mday - 0x20U < 0xffffffe1) {
    uVar5 = uVar7;
  }
  uVar6 = (ulong)(uint)month;
  if (month - 0xdU < 0xfffffff4) {
    uVar6 = uVar7;
  }
  year_00 = (uint)uVar4;
  month_00 = (uint)uVar6;
  date_00 = (uint)uVar5;
  if (date_format == YearDayOfYear) {
    uVar2 = ON_DayOfGregorianYear(year_00,month_00,date_00);
  }
  ds[0] = L'-';
  if (date_separator != L'\0') {
    ds[0] = date_separator;
  }
  wVar3 = L' ';
  if (date_time_separator != L'\0') {
    wVar3 = date_time_separator;
  }
  ts[0] = L':';
  if (time_separator != L'\0') {
    ts[0] = time_separator;
  }
  if (date_format == YearDayOfYear) {
    bVar1 = 0 < (int)uVar2;
  }
  else {
    bVar1 = date_00 != 0 && month_00 != 0;
  }
  ds[1] = L'\0';
  ts[1] = L'\0';
  pwVar8 = L"AM";
  if (0xb < hour) {
    pwVar8 = L"PM";
  }
  ON_wString(&date);
  switch(date_format) {
  case Unset:
  case Omit:
    goto switchD_005c63aa_caseD_0;
  case YearMonthDay:
    FormatToString((wchar_t *)&hms,L"%d%ls%d%ls%d",uVar4,ds,uVar6,ds,date_00);
    operator=(&date,&hms);
    break;
  case YearDayMonth:
    FormatToString((wchar_t *)&hms,L"%d%ls%d%ls%d",uVar4,ds,uVar5,ds,month_00);
    operator=(&date,&hms);
    break;
  case MonthDayYear:
    FormatToString((wchar_t *)&hms,L"%d%ls%d%ls%d",uVar6,ds,uVar5,ds,year_00);
    operator=(&date,&hms);
    break;
  case DayMonthYear:
    FormatToString((wchar_t *)&hms,L"%d%ls%d%ls%d",uVar5,ds,uVar6,ds,year_00);
    operator=(&date,&hms);
    break;
  case YearDayOfYear:
    FormatToString((wchar_t *)&hms,L"%d%ls%d",uVar4,ds,(ulong)uVar2);
    operator=(&date,&hms);
    break;
  default:
    goto switchD_005c63aa_default;
  }
  ~ON_wString(&hms);
switchD_005c63aa_default:
  if (!bVar1) {
    ON_wString(this,&EmptyString);
    goto LAB_005c665d;
  }
switchD_005c63aa_caseD_0:
  ON_wString(&hms);
  switch(time_format) {
  case HourMinute12:
    FormatToString(dts,L"%02d%ls%02d%ls",(long)hour % 0xc & 0xffffffff,ts,(ulong)(uint)minute,pwVar8
                  );
    operator=(&hms,(ON_wString *)dts);
    break;
  case HourMinuteSecond12:
    FormatToString(dts,L"%02d%ls%02d%ls%02d%ls",(long)hour % 0xc & 0xffffffff,ts,(ulong)(uint)minute
                   ,ts,second,pwVar8);
    operator=(&hms,(ON_wString *)dts);
    break;
  case HourMinute24:
    FormatToString(dts,L"%02d%ls%02d",(ulong)(uint)hour,ts,(ulong)(uint)minute);
    operator=(&hms,(ON_wString *)dts);
    break;
  case HourMinuteSecond24:
    FormatToString(dts,L"%02d%ls%02d%ls%02d",(ulong)(uint)hour,ts,(ulong)(uint)minute,ts,second);
    operator=(&hms,(ON_wString *)dts);
    break;
  default:
    goto switchD_005c64f5_default;
  }
  ~ON_wString((ON_wString *)dts);
switchD_005c64f5_default:
  ON_wString(this,&date);
  bVar1 = IsNotEmpty(this);
  if ((bVar1) && (bVar1 = IsNotEmpty(&hms), bVar1)) {
    dts[1] = L'\0';
    dts[0] = wVar3;
    operator+=(this,dts);
  }
  operator+=(this,&hms);
  ~ON_wString(&hms);
LAB_005c665d:
  ~ON_wString(&date);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_wString::FromYearMonthDayHourMinuteSecond(
  int year,
  int month,
  int mday,
  int hour,
  int minute,
  int second,
  ON_DateFormat date_format,
  ON_TimeFormat time_format,
  wchar_t date_separator,
  wchar_t date_time_separator,
  wchar_t time_separator
)
{
  if (year < 1582)
    year = 0;

  if (mday < 1 || mday > 31)
    mday = 0;

  if (month < 1 || month > 12)
    month = 0;

  const int yday
    = (ON_DateFormat::YearDayOfYear == date_format)
    ? ON_DayOfGregorianYear(year, month, mday)
    : 0;

  if (0 == date_separator)
    date_separator = ON_wString::HyphenMinus;
  if (0 == date_time_separator)
    date_time_separator = ON_wString::Space;
  if (0 == time_separator)
    time_separator = ':';
  
  bool bValidDate 
    = ON_DateFormat::YearDayOfYear == date_format
    ? (yday > 0)
    : (month > 0 && mday > 0);
  bool bValidHMS = (hour >= 0 && minute >= 0 && second >= 0 && hour < 24 && minute <= 59 && second <= 59);


  const wchar_t ds[2] = { date_separator, 0 };
  const wchar_t ts[2] = { time_separator, 0 };
  const wchar_t* ampm = (hour >= 12) ? L"PM" : L"AM";
  
  ON_wString date;
  switch (date_format)
  {
  case ON_DateFormat::Unset:
    bValidDate = true;
    break;
  case ON_DateFormat::Omit:
    bValidDate = true;
    break;
  case ON_DateFormat::YearMonthDay:
    date = ON_wString::FormatToString(L"%d%ls%d%ls%d", year, ds, month, ds, mday);
    break;
  case ON_DateFormat::YearDayMonth:
    date = ON_wString::FormatToString(L"%d%ls%d%ls%d", year, ds, mday, ds, month);
    break;
  case ON_DateFormat::MonthDayYear:
    date = ON_wString::FormatToString(L"%d%ls%d%ls%d", month, ds, mday, ds, year);
    break;
  case ON_DateFormat::DayMonthYear:
    date = ON_wString::FormatToString(L"%d%ls%d%ls%d", mday, ds, month, ds, year);
    break;
  case ON_DateFormat::YearDayOfYear:
    date = ON_wString::FormatToString(L"%d%ls%d", year, ds, yday);
    break;
  default:
    break;
  }
  if (false == bValidDate)
    return ON_wString::EmptyString;
  
  ON_wString hms;
  switch (time_format)
  {
  case ON_TimeFormat::Unset:
    bValidHMS = true;
    break;
  case ON_TimeFormat::Omit:
    bValidHMS = true;
    break;
  case ON_TimeFormat::HourMinute12:
    hms = ON_wString::FormatToString(L"%02d%ls%02d%ls", hour%12, ts, minute, ampm);
    break;
  case ON_TimeFormat::HourMinuteSecond12:
    hms = ON_wString::FormatToString(L"%02d%ls%02d%ls%02d%ls", hour%12, ts, minute, ts, second, ampm);
    break;
  case ON_TimeFormat::HourMinute24:
    hms = ON_wString::FormatToString(L"%02d%ls%02d", hour, ts, minute);
    break;
  case ON_TimeFormat::HourMinuteSecond24:
    hms = ON_wString::FormatToString(L"%02d%ls%02d%ls%02d", hour, ts, minute, ts, second);
    break;
  default:
    break;
  }

  ON_wString result = date;
  if (result.IsNotEmpty() && hms.IsNotEmpty())
  {
    const wchar_t dts[] = { date_time_separator,0 };
    result += dts;
  }
  result += hms;

  return result;
}